

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

int __thiscall
google::protobuf::internal::EpsCopyInputStream::PushLimit
          (EpsCopyInputStream *this,char *ptr,int limit)

{
  int iVar1;
  char *pcVar2;
  LogMessage *other;
  int *piVar3;
  int local_74;
  int old_limit;
  byte local_59;
  LogMessage local_58;
  int local_1c;
  char *pcStack_18;
  int limit_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  local_59 = 0;
  local_1c = limit;
  pcStack_18 = ptr;
  ptr_local = (char *)this;
  if ((limit < 0) || (0x7fffffef < limit)) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
               ,0x81);
    local_59 = 1;
    other = LogMessage::operator<<
                      (&local_58,"CHECK failed: limit >= 0 && limit <= INT_MAX - kSlopBytes: ");
    LogFinisher::operator=((LogFinisher *)((long)&old_limit + 3),other);
  }
  if ((local_59 & 1) != 0) {
    LogMessage::~LogMessage(&local_58);
  }
  local_1c = ((int)pcStack_18 - (int)this->buffer_end_) + local_1c;
  pcVar2 = this->buffer_end_;
  local_74 = 0;
  piVar3 = std::min<int>(&local_74,&local_1c);
  this->limit_end_ = pcVar2 + *piVar3;
  iVar1 = this->limit_;
  this->limit_ = local_1c;
  return iVar1 - local_1c;
}

Assistant:

PROTOBUF_NODISCARD int PushLimit(const char* ptr, int limit) {
    GOOGLE_DCHECK(limit >= 0 && limit <= INT_MAX - kSlopBytes);
    // This add is safe due to the invariant above, because
    // ptr - buffer_end_ <= kSlopBytes.
    limit += static_cast<int>(ptr - buffer_end_);
    limit_end_ = buffer_end_ + (std::min)(0, limit);
    auto old_limit = limit_;
    limit_ = limit;
    return old_limit - limit;
  }